

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O0

void __thiscall
rsg::ValueRange::ValueRange(ValueRange *this,VariableType *type,Scalar *minVal,Scalar *maxVal)

{
  int iVar1;
  ConstStridedValueAccess<1> local_98;
  ConstStridedValueAccess<1> local_88;
  StridedValueRead<1> local_78;
  ConstStridedValueAccess<1> local_68;
  ConstStridedValueAccess<1> local_58;
  StridedValueRead<1> local_48;
  allocator<rsg::Scalar> local_36;
  allocator<rsg::Scalar> local_35 [13];
  Scalar *local_28;
  Scalar *maxVal_local;
  Scalar *minVal_local;
  VariableType *type_local;
  ValueRange *this_local;
  
  local_28 = maxVal;
  maxVal_local = minVal;
  minVal_local = (Scalar *)type;
  type_local = &this->m_type;
  VariableType::VariableType(&this->m_type,type);
  iVar1 = VariableType::getScalarSize((VariableType *)minVal_local);
  std::allocator<rsg::Scalar>::allocator(local_35);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_min,(long)iVar1,local_35);
  std::allocator<rsg::Scalar>::~allocator(local_35);
  iVar1 = VariableType::getScalarSize((VariableType *)minVal_local);
  std::allocator<rsg::Scalar>::allocator(&local_36);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_max,(long)iVar1,&local_36)
  ;
  std::allocator<rsg::Scalar>::~allocator(&local_36);
  ConstStridedValueAccess<1>::ConstStridedValueAccess
            (&local_58,(VariableType *)minVal_local,maxVal_local);
  local_48 = ConstStridedValueAccess<1>::value(&local_58);
  local_68 = (ConstStridedValueAccess<1>)getMin(this);
  StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_68,&local_48);
  ConstStridedValueAccess<1>::ConstStridedValueAccess
            (&local_88,(VariableType *)minVal_local,local_28);
  local_78 = ConstStridedValueAccess<1>::value(&local_88);
  local_98 = (ConstStridedValueAccess<1>)getMax(this);
  StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_98,&local_78);
  return;
}

Assistant:

ValueRange::ValueRange (const VariableType& type, const Scalar* minVal, const Scalar* maxVal)
	: m_type		(type)
	, m_min			(type.getScalarSize())
	, m_max			(type.getScalarSize())
{
	getMin() = ConstValueAccess(type, minVal).value();
	getMax() = ConstValueAccess(type, maxVal).value();
}